

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O1

vm_obj_id_t CVmObjBigNum::create<32>(int in_root_set,bignum_t<32> *b)

{
  vm_obj_id_t obj_id;
  CVmObjBigNum *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  this = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
  CVmObjBigNum(this,0x20);
  copy_val(*(char **)((long)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].ptr_ + 8),b->ext,0)
  ;
  return obj_id;
}

Assistant:

static vm_obj_id_t create(
        VMG_ int in_root_set, const bignum_t<prec> *b)
    {
        vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ prec);
        CVmObjBigNum *n = (CVmObjBigNum *)vm_objp(vmg_ id);
        copy_val(n->ext_, b->ext, FALSE);
        return id;
    }